

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O3

void __thiscall
ROM::Request::visit(Request *this,
                   function<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long)>
                   *add_item)

{
  int indentation_level;
  undefined4 local_6c;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_68._M_unused._M_object = &local_6c;
  local_6c = 0;
  local_10 = std::
             _Function_handler<void_(ROM::Request::ListType,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Utility/ROMCatalogue.cpp:183:3)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(ROM::Request::ListType,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Utility/ROMCatalogue.cpp:183:3)>
             ::_M_manager;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Utility/ROMCatalogue.cpp:187:3)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Utility/ROMCatalogue.cpp:187:3)>
             ::_M_manager;
  local_50 = std::
             _Function_handler<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Utility/ROMCatalogue.cpp:190:3)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Utility/ROMCatalogue.cpp:190:3)>
             ::_M_manager;
  local_68._8_8_ = add_item;
  local_48._M_unused._M_object = local_68._M_unused._M_object;
  local_28._M_unused._M_object = local_68._M_unused._M_object;
  local_28._8_8_ = add_item;
  Node::visit(&this->node,(function<void_(ROM::Request::ListType,_unsigned_long)> *)&local_28,
              (function<void_()> *)&local_48,
              (function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>
               *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void Request::visit(
	const std::function<void(LineItem, ListType, int, const ROM::Description *, bool, size_t)> &add_item
) const {
	int indentation_level = 0;
	node.visit(
		[&indentation_level, &add_item] (ROM::Request::ListType type, size_t size) {
			add_item(LineItem::NewList, type, indentation_level, nullptr, false, size);
			++indentation_level;
		},
		[&indentation_level] {
			--indentation_level;
		},
		[&indentation_level, &add_item] (ROM::Request::ListType type, const ROM::Description &rom, bool is_optional, size_t remaining) {
			add_item(LineItem::Description, type, indentation_level, &rom, is_optional, remaining);
		}
	);
}